

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectType.h
# Opt level: O3

void __thiscall DIS::LinearObjectStatePdu::setObjectType(LinearObjectStatePdu *this,ObjectType *pX)

{
  uchar uVar1;
  uchar uVar2;
  uchar uVar3;
  
  uVar1 = pX->_objectKind;
  uVar2 = pX->_category;
  uVar3 = pX->_subcategory;
  (this->_objectType)._domain = pX->_domain;
  (this->_objectType)._objectKind = uVar1;
  (this->_objectType)._category = uVar2;
  (this->_objectType)._subcategory = uVar3;
  return;
}

Assistant:

class OPENDIS7_EXPORT ObjectType
{
protected:
  /** Domain of entity (air, surface, subsurface, space, etc) */
  unsigned char _domain; 

  /** country to which the design of the entity is attributed */
  unsigned char _objectKind; 

  /** category of entity */
  unsigned char _category; 

  /** subcategory of entity */
  unsigned char _subcategory; 


 public:
    ObjectType();
    virtual ~ObjectType();

    virtual void marshal(DataStream& dataStream) const;
    virtual void unmarshal(DataStream& dataStream);

    unsigned char getDomain() const; 
    void setDomain(unsigned char pX); 

    unsigned char getObjectKind() const; 
    void setObjectKind(unsigned char pX); 

    unsigned char getCategory() const; 
    void setCategory(unsigned char pX); 

    unsigned char getSubcategory() const; 
    void setSubcategory(unsigned char pX); 


virtual int getMarshalledSize() const;

     bool operator  ==(const ObjectType& rhs) const;
}